

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O3

TsStatus_t ts_message_set_at(TsMessageRef_t array,size_t index,TsMessageRef_t item)

{
  char *pcVar1;
  TsStatus_t TVar2;
  size_t i;
  ulong uVar3;
  TsMessageRef_t current;
  TsMessageRef_t local_28;
  
  TVar2 = TsStatusErrorPreconditionFailed;
  if ((array != (TsMessageRef_t)0x0) &&
     (TVar2 = TsStatusErrorPreconditionFailed, array->type == TsTypeArray)) {
    uVar3 = 0;
    do {
      if (*(long *)(array->name + uVar3 * 8 + 0x1c) == 0) goto LAB_00101bad;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0xf);
    uVar3 = 0xf;
LAB_00101bad:
    TVar2 = TsStatusErrorIndexOutOfRange;
    if ((index <= uVar3 && index < 0xf) &&
       (TVar2 = TsStatusError, item != (TsMessageRef_t)0x0 || uVar3 - 1 <= index)) {
      local_28 = *(TsMessageRef_t *)(array->name + index * 8 + 0x1c);
      if (local_28 != (TsMessageRef_t)0x0) {
        pcVar1 = array->name + index * 8 + 0x1c;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        ts_message_destroy(local_28);
      }
      ts_message_create_copy(item,&local_28);
      *(TsMessageRef_t *)(array->name + index * 8 + 0x1c) = local_28;
      TVar2 = TsStatusOk;
    }
  }
  return TVar2;
}

Assistant:

TsStatus_t ts_message_set_at(TsMessageRef_t array, size_t index, TsMessageRef_t item)
{
	/* check preconditions */
	if (array == NULL || array->type != TsTypeArray) {
		return TsStatusErrorPreconditionFailed;
	}
	size_t length;
	ts_message_get_size(array, &length);
	if (index >= TS_MESSAGE_MAX_BRANCHES || index > length) {
		return TsStatusErrorIndexOutOfRange;
	}

	/* note, passing NULL in item is the same as resizing the array */
	if (item == NULL && index < length - 1) {
		/* the caller should set the contents to NULL, not the item itself */
		return TsStatusErrorBadRequest;
	}

	/* remove old,... */
	TsMessageRef_t current = array->value._xfields[index];
	if (current != NULL) {
		array->value._xfields[index] = NULL;
		ts_message_destroy(current);
	}

	/* ...and set new and return */
	ts_message_create_copy(item, &current);
	array->value._xfields[index] = current;
	return TsStatusOk;
}